

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

int Extra_Truth6Ones(word t)

{
  ulong uVar1;
  long lVar2;
  word t_local;
  
  uVar1 = (t & 0x5555555555555555) + (t >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
  uVar1 = (uVar1 & 0xf0f0f0f0f0f0f0f) + (uVar1 >> 4 & 0xf0f0f0f0f0f0f0f);
  uVar1 = (uVar1 & 0xff00ff00ff00ff) + (uVar1 >> 8 & 0xff00ff00ff00ff);
  lVar2 = (uVar1 & 0xffff0000ffff) + (uVar1 >> 0x10 & 0xffff0000ffff);
  return (int)lVar2 + (int)((ulong)lVar2 >> 0x20);
}

Assistant:

static inline int Extra_Truth6Ones( word t )
{
    t =    (t & ABC_CONST(0x5555555555555555)) + ((t>> 1) & ABC_CONST(0x5555555555555555));
    t =    (t & ABC_CONST(0x3333333333333333)) + ((t>> 2) & ABC_CONST(0x3333333333333333));
    t =    (t & ABC_CONST(0x0F0F0F0F0F0F0F0F)) + ((t>> 4) & ABC_CONST(0x0F0F0F0F0F0F0F0F));
    t =    (t & ABC_CONST(0x00FF00FF00FF00FF)) + ((t>> 8) & ABC_CONST(0x00FF00FF00FF00FF));
    t =    (t & ABC_CONST(0x0000FFFF0000FFFF)) + ((t>>16) & ABC_CONST(0x0000FFFF0000FFFF));
    return (t & ABC_CONST(0x00000000FFFFFFFF)) +  (t>>32);
}